

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

double P_GetMoveFactor(AActor *mo,double *frictionp)

{
  double dVar1;
  double dVar2;
  double movefactor;
  double local_20;
  double local_18;
  
  local_18 = P_GetFriction(mo,&local_20);
  if (local_18 < 0.90625) {
    dVar2 = (mo->Vel).X;
    dVar1 = (mo->Vel).Y;
    dVar2 = c_sqrt(dVar1 * dVar1 + dVar2 * dVar2);
    if (dVar2 <= 0.91552734375) {
      if (dVar2 <= 0.457763671875) {
        if (0.2288818359375 < dVar2) {
          local_20 = local_20 + local_20;
        }
      }
      else {
        local_20 = local_20 * 4.0;
      }
    }
    else {
      local_20 = local_20 * 8.0;
    }
  }
  if (frictionp != (double *)0x0) {
    *frictionp = local_18;
  }
  return local_20;
}

Assistant:

double P_GetMoveFactor(const AActor *mo, double *frictionp)
{
	double movefactor, friction;

	// If the floor is icy or muddy, it's harder to get moving. This is where
	// the different friction factors are applied to 'trying to move'. In
	// p_mobj.c, the friction factors are applied as you coast and slow down.

	if ((friction = P_GetFriction(mo, &movefactor)) < ORIG_FRICTION)
	{
		// phares 3/11/98: you start off slowly, then increase as
		// you get better footing

		double velocity = mo->VelXYToSpeed();

		if (velocity > MORE_FRICTION_VELOCITY * 4)
			movefactor *= 8;
		else if (velocity > MORE_FRICTION_VELOCITY * 2)
			movefactor *= 4;
		else if (velocity > MORE_FRICTION_VELOCITY)
			movefactor *= 2;
	}

	if (frictionp)
		*frictionp = friction;

	return movefactor;
}